

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

void Fossilize::hash_variant
               (Hasher *h,VariantDependency dep,VkPhysicalDeviceProperties2 *props,
               VkApplicationInfo *info,void *device_pnext,bool feature_hash)

{
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT *pVVar1;
  VkPhysicalDeviceBufferDeviceAddressFeatures *pVVar2;
  VkPhysicalDeviceVulkan12Features *pVVar3;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *pVVar4;
  VkPhysicalDeviceDynamicRenderingFeatures *pVVar5;
  VkPhysicalDeviceVulkan13Features *pVVar6;
  VkPhysicalDeviceDescriptorIndexingFeatures *pVVar7;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *pVVar8;
  char *local_170;
  char *local_160;
  bool local_141;
  bool local_137;
  bool local_136;
  bool local_135;
  bool local_134;
  bool local_133;
  bool local_132;
  bool local_131;
  bool local_121;
  bool local_111;
  bool local_102;
  bool local_101;
  bool local_100;
  bool local_ff;
  bool local_fe;
  bool local_fd;
  uint32_t local_fc;
  bool enabled_5;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer;
  bool enabled_4;
  VkPhysicalDeviceVulkan12Features *features12_1;
  VkPhysicalDeviceDescriptorIndexingFeatures *indexing;
  bool enabled_3;
  VkPhysicalDeviceVulkan13Features *features13;
  VkPhysicalDeviceDynamicRenderingFeatures *dynamic_rendering;
  bool enabled_2;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *vrs;
  bool enabled_1;
  VkPhysicalDeviceVulkan12Features *features12;
  VkPhysicalDeviceBufferDeviceAddressFeatures *bda;
  bool enabled;
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT *mut;
  undefined1 local_68 [7];
  bool hash_enabled;
  VkApplicationInfo default_app_info;
  bool feature_hash_local;
  void *device_pnext_local;
  VkApplicationInfo *info_local;
  VkPhysicalDeviceProperties2 *props_local;
  VariantDependency dep_local;
  Hasher *h_local;
  
  default_app_info.apiVersion._3_1_ = feature_hash;
  memset(local_68,0,0x30);
  mut._7_1_ = true;
  device_pnext_local = info;
  if (info == (VkApplicationInfo *)0x0) {
    device_pnext_local = local_68;
  }
  switch(dep) {
  case VendorID:
    if (props == (VkPhysicalDeviceProperties2 *)0x0) {
      local_fc = 0;
    }
    else {
      local_fc = (props->properties).vendorID;
    }
    Hasher::u32(h,local_fc);
    break;
  case MutableDescriptorType:
    pVVar1 = find_pnext<VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT,
                        device_pnext);
    local_fd = false;
    if (pVVar1 != (VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT *)0x0) {
      local_fd = pVVar1->mutableDescriptorType != 0;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) && (mut._7_1_ = local_fd, local_fd != false))
    {
      Hasher::u32(h,0x3ba02518);
    }
    if (mut._7_1_ != false) {
      Hasher::u32(h,(uint)local_fd);
    }
    break;
  case BindlessUBO:
    pVVar7 = find_pnext<VkPhysicalDeviceDescriptorIndexingFeatures>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES,device_pnext)
    ;
    pVVar3 = find_pnext<VkPhysicalDeviceVulkan12Features>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,device_pnext);
    if ((pVVar7 == (VkPhysicalDeviceDescriptorIndexingFeatures *)0x0) ||
       (local_133 = true, pVVar7->descriptorBindingUniformBufferUpdateAfterBind == 0)) {
      local_134 = false;
      if (pVVar3 != (VkPhysicalDeviceVulkan12Features *)0x0) {
        local_134 = pVVar3->descriptorBindingUniformBufferUpdateAfterBind != 0;
      }
      local_133 = local_134;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) &&
       (mut._7_1_ = local_133, local_133 != false)) {
      Hasher::u32(h,0x3b9d3ee9);
      Hasher::u32(h,10);
    }
    if (mut._7_1_ != false) {
      Hasher::u32(h,(uint)local_133);
    }
    break;
  case BufferDeviceAddress:
    pVVar2 = find_pnext<VkPhysicalDeviceBufferDeviceAddressFeatures>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES,
                        device_pnext);
    pVVar3 = find_pnext<VkPhysicalDeviceVulkan12Features>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,device_pnext);
    if ((pVVar2 == (VkPhysicalDeviceBufferDeviceAddressFeatures *)0x0) ||
       (local_fe = true, pVVar2->bufferDeviceAddress == 0)) {
      local_ff = false;
      if (pVVar3 != (VkPhysicalDeviceVulkan12Features *)0x0) {
        local_ff = pVVar3->bufferDeviceAddress != 0;
      }
      local_fe = local_ff;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) && (mut._7_1_ = local_fe, local_fe != false))
    {
      Hasher::u32(h,0x3b9eb5e8);
    }
    if (mut._7_1_ != false) {
      Hasher::u32(h,(uint)local_fe);
    }
    break;
  case ApplicationVersion:
    Hasher::u32(h,*(uint32_t *)((long)device_pnext_local + 0x18));
    break;
  case EngineVersion:
    Hasher::u32(h,*(uint32_t *)((long)device_pnext_local + 0x28));
    break;
  case ApplicationVersionMajor:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x18) >> 0x16);
    break;
  case ApplicationVersionMinor:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x18) >> 0xc & 0x3ff);
    break;
  case ApplicationVersionPatch:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x18) & 0xfff);
    break;
  case EngineVersionMajor:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x28) >> 0x16);
    break;
  case EngineVersionMinor:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x28) >> 0xc & 0x3ff);
    break;
  case EngineVersionPatch:
    Hasher::u32(h,*(uint *)((long)device_pnext_local + 0x28) & 0xfff);
    break;
  case ApplicationName:
    if (*(long *)((long)device_pnext_local + 0x10) == 0) {
      local_160 = "";
    }
    else {
      local_160 = *(char **)((long)device_pnext_local + 0x10);
    }
    Hasher::string(h,local_160);
    break;
  case EngineName:
    if (*(long *)((long)device_pnext_local + 0x20) == 0) {
      local_170 = "";
    }
    else {
      local_170 = *(char **)((long)device_pnext_local + 0x20);
    }
    Hasher::string(h,local_170);
    break;
  case FragmentShadingRate:
    pVVar4 = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR,
                        device_pnext);
    local_100 = false;
    if (pVVar4 != (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0) {
      local_101 = true;
      if ((pVVar4->attachmentFragmentShadingRate == 0) &&
         (local_101 = true, pVVar4->pipelineFragmentShadingRate == 0)) {
        local_101 = pVVar4->primitiveFragmentShadingRate != 0;
      }
      local_100 = local_101;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) &&
       (mut._7_1_ = local_100, local_100 != false)) {
      Hasher::u32(h,0x3b9e3cd3);
    }
    if (mut._7_1_ != false) {
      local_102 = false;
      if (pVVar4 != (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0) {
        local_102 = pVVar4->attachmentFragmentShadingRate != 0;
      }
      Hasher::u32(h,(uint)local_102);
      local_111 = false;
      if (pVVar4 != (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0) {
        local_111 = pVVar4->pipelineFragmentShadingRate != 0;
      }
      Hasher::u32(h,(uint)local_111);
      local_121 = false;
      if (pVVar4 != (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0) {
        local_121 = pVVar4->primitiveFragmentShadingRate != 0;
      }
      Hasher::u32(h,(uint)local_121);
    }
    break;
  case DynamicRendering:
    pVVar5 = find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES,device_pnext);
    pVVar6 = find_pnext<VkPhysicalDeviceVulkan13Features>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES,device_pnext);
    if ((pVVar5 == (VkPhysicalDeviceDynamicRenderingFeatures *)0x0) ||
       (local_131 = true, pVVar5->dynamicRendering == 0)) {
      local_132 = false;
      if (pVVar6 != (VkPhysicalDeviceVulkan13Features *)0x0) {
        local_132 = pVVar6->dynamicRendering != 0;
      }
      local_131 = local_132;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) &&
       (mut._7_1_ = local_131, local_131 != false)) {
      Hasher::u32(h,0x3b9b75e3);
    }
    if (mut._7_1_ != false) {
      Hasher::u32(h,(uint)local_131);
    }
    break;
  case DescriptorBuffer:
    pVVar8 = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>
                       (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
                        device_pnext);
    local_135 = false;
    if (pVVar8 != (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)0x0) {
      local_136 = true;
      if (pVVar8->descriptorBuffer == 0) {
        local_136 = pVVar8->descriptorBufferPushDescriptors != 0;
      }
      local_135 = local_136;
    }
    if (((default_app_info.apiVersion._3_1_ & 1) != 0) &&
       (mut._7_1_ = local_135, local_135 != false)) {
      Hasher::u32(h,0x3b9f9c62);
    }
    if (mut._7_1_ != false) {
      local_137 = false;
      if (pVVar8 != (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)0x0) {
        local_137 = pVVar8->descriptorBuffer != 0;
      }
      Hasher::u32(h,(uint)local_137);
      local_141 = false;
      if (pVVar8 != (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)0x0) {
        local_141 = pVVar8->descriptorBufferPushDescriptors != 0;
      }
      Hasher::u32(h,(uint)local_141);
    }
  }
  return;
}

Assistant:

static void hash_variant(Hasher &h, VariantDependency dep,
                         const VkPhysicalDeviceProperties2 *props,
                         const VkApplicationInfo *info,
                         const void *device_pnext,
                         bool feature_hash)
{
	const VkApplicationInfo default_app_info = { VK_STRUCTURE_TYPE_APPLICATION_INFO };
	bool hash_enabled = true;

	if (!info)
		info = &default_app_info;

	switch (dep)
	{
	case VariantDependency::VendorID:
		h.u32(props ? props->properties.vendorID : 0);
		break;

	case VariantDependency::MutableDescriptorType:
	{
		auto *mut = find_pnext<VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT,
				device_pnext);

		bool enabled = mut && mut->mutableDescriptorType;

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BufferDeviceAddress:
	{
		auto *bda = find_pnext<VkPhysicalDeviceBufferDeviceAddressFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);

		bool enabled = (bda && bda->bufferDeviceAddress) ||
		               (features12 && features12->bufferDeviceAddress);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::FragmentShadingRate:
	{
		auto *vrs = find_pnext<VkPhysicalDeviceFragmentShadingRateFeaturesKHR>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR, device_pnext);

		bool enabled = vrs && (vrs->attachmentFragmentShadingRate ||
		                       vrs->pipelineFragmentShadingRate ||
		                       vrs->primitiveFragmentShadingRate);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(vrs && vrs->attachmentFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->pipelineFragmentShadingRate));
			h.u32(uint32_t(vrs && vrs->primitiveFragmentShadingRate));
		}
		break;
	}

	case VariantDependency::DynamicRendering:
	{
		auto *dynamic_rendering = find_pnext<VkPhysicalDeviceDynamicRenderingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES, device_pnext);
		auto *features13 = find_pnext<VkPhysicalDeviceVulkan13Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES, device_pnext);
		bool enabled = (dynamic_rendering && dynamic_rendering->dynamicRendering) ||
		               (features13 && features13->dynamicRendering);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES);
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::BindlessUBO:
	{
		auto *indexing = find_pnext<VkPhysicalDeviceDescriptorIndexingFeatures>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES,
				device_pnext);
		auto *features12 = find_pnext<VkPhysicalDeviceVulkan12Features>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES,
				device_pnext);
		bool enabled = (indexing && indexing->descriptorBindingUniformBufferUpdateAfterBind) ||
		               (features12 && features12->descriptorBindingUniformBufferUpdateAfterBind);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
			{
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES);
				// 10th feature element.
				// Just arbitrary to distinguish potential hashing on different
				// sub-features of this struct at some other point.
				h.u32(10);
			}
		}

		if (hash_enabled)
			h.u32(uint32_t(enabled));
		break;
	}

	case VariantDependency::DescriptorBuffer:
	{
		auto *descriptor_buffer = find_pnext<VkPhysicalDeviceDescriptorBufferFeaturesEXT>(
				VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT,
				device_pnext);
		bool enabled = descriptor_buffer && (descriptor_buffer->descriptorBuffer ||
		                                     descriptor_buffer->descriptorBufferPushDescriptors);

		if (feature_hash)
		{
			hash_enabled = enabled;
			if (enabled)
				h.u32(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT);
		}

		if (hash_enabled)
		{
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBuffer));
			h.u32(uint32_t(descriptor_buffer && descriptor_buffer->descriptorBufferPushDescriptors));
			// The other feature bits are highly unlikely to ever affect
			// pipeline construction in application in any meaningful way.
		}
		break;
	}

	case VariantDependency::ApplicationVersion:
		h.u32(info->applicationVersion);
		break;

	case VariantDependency::ApplicationVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionMinor:
		h.u32(VK_VERSION_MINOR(info->applicationVersion));
		break;

	case VariantDependency::ApplicationVersionPatch:
		h.u32(VK_VERSION_PATCH(info->applicationVersion));
		break;

	case VariantDependency::EngineVersion:
		h.u32(info->engineVersion);
		break;

	case VariantDependency::EngineVersionMajor:
		h.u32(VK_VERSION_MAJOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionMinor:
		h.u32(VK_VERSION_MINOR(info->engineVersion));
		break;

	case VariantDependency::EngineVersionPatch:
		h.u32(VK_VERSION_PATCH(info->engineVersion));
		break;

	case VariantDependency::ApplicationName:
		h.string(info->pApplicationName ? info->pApplicationName : "");
		break;

	case VariantDependency::EngineName:
		h.string(info->pEngineName ? info->pEngineName : "");
		break;

	default:
		break;
	}
}